

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  pointer __last;
  char cVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  istream *piVar7;
  pointer pcVar8;
  bool need_singles;
  bool need_singles_00;
  bool need_singles_01;
  bool need_singles_02;
  uint uVar9;
  size_t i_1;
  ulong uVar10;
  char *pcVar11;
  undefined4 in_register_0000003c;
  string *this;
  string *this_00;
  pointer pKVar12;
  long lVar13;
  size_t i;
  char **__x;
  ulong uVar14;
  bool bVar15;
  double dVar16;
  undefined1 auVar17 [16];
  string dic_name;
  string line;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> kvs;
  allocator local_1571;
  pointer local_1570;
  int local_1568;
  uint local_1564;
  pointer local_1560;
  ulong local_1558;
  char **local_1550;
  ulong local_1548;
  string file_name;
  KeyReader reader;
  
  poVar5 = (ostream *)CONCAT44(in_register_0000003c,argc);
  this = &dic_name;
  this_00 = &dic_name;
  if (argc < 2) {
switchD_00118540_default:
    anon_unknown.dwarf_266b9::show_usage(poVar5);
    return 1;
  }
  switch(*argv[1]) {
  case '1':
    poVar5 = std::operator<<((ostream *)&std::cout,"run insertion");
    std::endl<char,std::char_traits<char>>(poVar5);
    if ((uint)argc < 5) goto switchD_00118540_default;
    kvs.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (argc == 5) {
      std::__cxx11::string::string((string *)&file_name,argv[2],(allocator *)&dic_name);
      anon_unknown.dwarf_266b9::create_dic((anon_unknown_dwarf_266b9 *)&reader,&file_name);
      pKVar12 = (pointer)reader._0_8_;
      kvs.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)reader._0_8_;
      this = &file_name;
      std::__cxx11::string::~string((string *)this);
    }
    else {
      dic_name.field_2._M_allocated_capacity = 0;
      dic_name._M_dataplus._M_p = (pointer)0x0;
      dic_name._M_string_length = 0;
      __x = argv + 5;
      lVar13 = (ulong)(uint)argc - 5;
      while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)&dic_name,__x);
        __x = __x + 1;
      }
      std::__cxx11::string::string((string *)&line,argv[2],&local_1571);
      bVar15 = std::operator==(&line,"MLT");
      if (bVar15) {
        ddd::
        make_unique<ddd::DictionaryMLT<false,false>,std::vector<char_const*,std::allocator<char_const*>>&>
                  ((ddd *)&reader,(vector<const_char_*,_std::allocator<const_char_*>_> *)&dic_name);
        pKVar12 = (pointer)reader._0_8_;
      }
      else {
        bVar15 = std::operator==(&line,"MLT_NL");
        if (bVar15) {
          ddd::
          make_unique<ddd::DictionaryMLT<false,true>,std::vector<char_const*,std::allocator<char_const*>>&>
                    ((ddd *)&reader,(vector<const_char_*,_std::allocator<const_char_*>_> *)&dic_name
                    );
          pKVar12 = (pointer)reader._0_8_;
        }
        else {
          bVar15 = std::operator==(&line,"MLT_BL");
          if (bVar15) {
            ddd::
            make_unique<ddd::DictionaryMLT<true,false>,std::vector<char_const*,std::allocator<char_const*>>&>
                      ((ddd *)&reader,
                       (vector<const_char_*,_std::allocator<const_char_*>_> *)&dic_name);
            pKVar12 = (pointer)reader._0_8_;
          }
          else {
            bVar15 = std::operator==(&line,"MLT_NL_BL");
            if (bVar15) {
              ddd::
              make_unique<ddd::DictionaryMLT<true,true>,std::vector<char_const*,std::allocator<char_const*>>&>
                        ((ddd *)&reader,
                         (vector<const_char_*,_std::allocator<const_char_*>_> *)&dic_name);
              pKVar12 = (pointer)reader._0_8_;
            }
            else {
              std::__cxx11::string::string((string *)&reader,(string *)&line);
              anon_unknown.dwarf_266b9::create_dic
                        ((anon_unknown_dwarf_266b9 *)&local_1570,(string *)&reader);
              std::__cxx11::string::~string((string *)&reader);
              pKVar12 = local_1570;
            }
          }
        }
      }
      kvs.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
      super__Vector_impl_data._M_start = pKVar12;
      std::__cxx11::string::~string((string *)&line);
      std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&dic_name);
    }
    if (pKVar12 == (pointer)0x0) {
      anon_unknown.dwarf_266b9::show_usage((ostream *)this);
      return 1;
    }
    anon_unknown.dwarf_266b9::KeyReader::KeyReader(&reader,argv[4]);
    if (((&reader.field_0x20)[*(long *)(reader._0_8_ + -0x18)] & 5) != 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"failed to open ");
      poVar5 = std::operator<<(poVar5,argv[4]);
      std::endl<char,std::char_traits<char>>(poVar5);
LAB_00119252:
      anon_unknown.dwarf_266b9::KeyReader::~KeyReader(&reader);
LAB_0011925f:
      uVar9 = 1;
      goto LAB_0011941d;
    }
    dic_name._M_dataplus._M_p = (pointer)std::chrono::_V2::system_clock::now();
    uVar9 = 0;
    do {
      pcVar11 = anon_unknown.dwarf_266b9::KeyReader::next(&reader);
      if (pcVar11 == (char *)0x0) {
        std::operator<<((ostream *)&std::cout,"- insertion time: ");
        dVar16 = anon_unknown.dwarf_266b9::StopWatch::operator()((StopWatch *)&dic_name,micro);
        poVar5 = std::ostream::_M_insert<double>(dVar16 / (double)uVar9);
        poVar5 = std::operator<<(poVar5," us / key");
        std::endl<char,std::char_traits<char>>(poVar5);
        goto LAB_0011931b;
      }
      cVar2 = (**(code **)((pKVar12->key)._M_dataplus._M_p + 0x20))(pKVar12,pcVar11,uVar9);
      uVar9 = uVar9 + 1;
    } while (cVar2 != '\0');
    poVar5 = std::operator<<((ostream *)&std::cerr,"failed to insert ");
    poVar5 = std::operator<<(poVar5,pcVar11);
    std::endl<char,std::char_traits<char>>(poVar5);
LAB_0011931b:
    anon_unknown.dwarf_266b9::KeyReader::~KeyReader(&reader);
    if (pcVar11 != (char *)0x0) goto LAB_0011925f;
    anon_unknown.dwarf_266b9::show_stat
              ((ostream *)&kvs,
               (unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)0x1,
               need_singles_02);
    std::__cxx11::string::string((string *)&dic_name,argv[3],(allocator *)&reader);
    std::__cxx11::string::append((char *)&dic_name);
    std::__cxx11::string::append((char *)&dic_name);
    std::ofstream::ofstream(&reader,(string *)&dic_name,_S_out);
    uVar9 = *(uint *)(&reader.field_0x20 + *(long *)(reader._0_8_ + -0x18));
    if ((uVar9 & 5) == 0) {
      (**(code **)((pKVar12->key)._M_dataplus._M_p + 0x60))(pKVar12,&reader);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"failed to open ");
      poVar5 = std::operator<<(poVar5,(string *)&dic_name);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::ofstream::~ofstream(&reader);
    bVar15 = (uVar9 & 5) == 0;
    if (bVar15) {
      poVar5 = std::operator<<((ostream *)&std::cout,"write dic to ");
      poVar5 = std::operator<<(poVar5,(string *)&dic_name);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    uVar9 = (uint)!bVar15;
    goto LAB_00119418;
  case '2':
    poVar5 = std::operator<<((ostream *)&std::cout,"run deletion");
    std::endl<char,std::char_traits<char>>(poVar5);
    if ((uint)argc < 5) goto switchD_00118540_default;
    std::__cxx11::string::string((string *)&file_name,argv[2],(allocator *)&reader);
    anon_unknown.dwarf_266b9::read_dic((anon_unknown_dwarf_266b9 *)&kvs,&file_name);
    std::__cxx11::string::~string((string *)&file_name);
    pKVar12 = kvs.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (kvs.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      return 1;
    }
    anon_unknown.dwarf_266b9::KeyReader::KeyReader(&reader,argv[4]);
    if (((&reader.field_0x20)[*(long *)(reader._0_8_ + -0x18)] & 5) != 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"failed to open ");
      poVar5 = std::operator<<(poVar5,argv[4]);
      std::endl<char,std::char_traits<char>>(poVar5);
      goto LAB_00119252;
    }
    line._M_dataplus._M_p = (pointer)std::chrono::_V2::system_clock::now();
    uVar9 = 0;
    while (pcVar11 = anon_unknown.dwarf_266b9::KeyReader::next(&reader), pcVar11 != (char *)0x0) {
      iVar3 = (**(code **)((pKVar12->key)._M_dataplus._M_p + 0x28))(pKVar12,pcVar11);
      if (iVar3 == -1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"failed to delete ");
        poVar5 = std::operator<<(poVar5,pcVar11);
        std::endl<char,std::char_traits<char>>(poVar5);
        goto LAB_001190c5;
      }
      uVar9 = uVar9 + 1;
    }
    std::operator<<((ostream *)&std::cout,"- deletion time: ");
    dVar16 = anon_unknown.dwarf_266b9::StopWatch::operator()((StopWatch *)&line,micro);
    poVar5 = std::ostream::_M_insert<double>(dVar16 / (double)uVar9);
    poVar5 = std::operator<<(poVar5," us / key");
    std::endl<char,std::char_traits<char>>(poVar5);
LAB_001190c5:
    anon_unknown.dwarf_266b9::KeyReader::~KeyReader(&reader);
    if (pcVar11 != (char *)0x0) goto LAB_0011925f;
    uVar9 = 1;
    anon_unknown.dwarf_266b9::show_stat
              ((ostream *)&kvs,
               (unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)0x1,
               need_singles_01);
    std::__cxx11::string::string((string *)&line,argv[3],(allocator *)&reader);
    std::__cxx11::string::append((char *)&line);
    std::__cxx11::string::string((string *)&dic_name,argv[2],(allocator *)&local_1570);
    anon_unknown.dwarf_266b9::get_ext((string *)&reader,&dic_name);
    std::__cxx11::string::append((string *)&line);
    std::__cxx11::string::~string((string *)&reader);
    std::__cxx11::string::~string((string *)&dic_name);
    std::ofstream::ofstream(&reader,(string *)&line,_S_out);
    uVar1 = *(uint *)(&reader.field_0x20 + *(long *)(reader._0_8_ + -0x18));
    if ((uVar1 & 5) == 0) {
      (**(code **)((pKVar12->key)._M_dataplus._M_p + 0x60))(pKVar12,&reader);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"failed to open ");
      poVar5 = std::operator<<(poVar5,(string *)&line);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::ofstream::~ofstream(&reader);
    if ((uVar1 & 5) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"write dic to ");
      poVar5 = std::operator<<(poVar5,(string *)&line);
      uVar9 = 0;
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    break;
  case '3':
    poVar5 = std::operator<<((ostream *)&std::cout,"run search");
    std::endl<char,std::char_traits<char>>(poVar5);
    if ((uint)argc < 4) goto switchD_00118540_default;
    std::__cxx11::string::string((string *)&file_name,argv[2],(allocator *)&reader);
    anon_unknown.dwarf_266b9::read_dic((anon_unknown_dwarf_266b9 *)&kvs,&file_name);
    std::__cxx11::string::~string((string *)&file_name);
    pKVar12 = kvs.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (kvs.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      return 1;
    }
    dic_name._M_dataplus._M_p = (pointer)0x0;
    dic_name._M_string_length = 0;
    dic_name.field_2._M_allocated_capacity = 0;
    std::ifstream::ifstream(&reader,argv[3],_S_in);
    uVar9 = *(uint *)(&reader.field_0x20 + *(long *)(reader._0_8_ + -0x18));
    if ((uVar9 & 5) == 0) {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      std::ios_base::sync_with_stdio(false);
      while (piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&reader,(string *)&line),
            ((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) {
        if (line._M_string_length != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&dic_name,&line);
        }
      }
      std::__cxx11::string::~string((string *)&line);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"failed to open ");
      poVar5 = std::operator<<(poVar5,argv[3]);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::ifstream::~ifstream(&reader);
    if ((uVar9 & 5) == 0) {
      reader._0_8_ = std::chrono::_V2::system_clock::now();
      for (iVar3 = 0; iVar3 != 10; iVar3 = iVar3 + 1) {
        lVar13 = 0;
        for (uVar14 = 0;
            uVar14 < (ulong)((long)(dic_name._M_string_length - (long)dic_name._M_dataplus._M_p) >>
                            5); uVar14 = uVar14 + 1) {
          iVar4 = (**(code **)((pKVar12->key)._M_dataplus._M_p + 0x18))
                            (pKVar12,*(undefined8 *)(dic_name._M_dataplus._M_p + lVar13));
          if (iVar4 == -1) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"failed to search ");
            poVar5 = std::operator<<(poVar5,(string *)(dic_name._M_dataplus._M_p + lVar13));
            std::endl<char,std::char_traits<char>>(poVar5);
            goto LAB_00118ed7;
          }
          lVar13 = lVar13 + 0x20;
        }
      }
      std::operator<<((ostream *)&std::cout,"- search time: ");
      dVar16 = anon_unknown.dwarf_266b9::StopWatch::operator()((StopWatch *)&reader,micro);
      lVar13 = (long)(dic_name._M_string_length - (long)dic_name._M_dataplus._M_p) >> 5;
      auVar17._8_4_ =
           (int)((long)(dic_name._M_string_length - (long)dic_name._M_dataplus._M_p) >> 0x25);
      auVar17._0_8_ = lVar13;
      auVar17._12_4_ = 0x45300000;
      poVar5 = std::ostream::_M_insert<double>
                         ((dVar16 / ((auVar17._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0))
                          ) / 10.0);
      poVar5 = std::operator<<(poVar5," us / key (on ");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,10);
      poVar5 = std::operator<<(poVar5," runs)");
      uVar9 = 0;
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
LAB_00118ed7:
      uVar9 = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&dic_name);
    goto LAB_0011941d;
  case '4':
    poVar5 = std::operator<<((ostream *)&std::cout,"run rearrangement");
    std::endl<char,std::char_traits<char>>(poVar5);
    if ((uint)argc < 5) goto switchD_00118540_default;
    std::__cxx11::string::string((string *)&file_name,argv[3],(allocator *)&reader);
    anon_unknown.dwarf_266b9::read_dic((anon_unknown_dwarf_266b9 *)&kvs,&file_name);
    std::__cxx11::string::~string((string *)&file_name);
    pKVar12 = kvs.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (kvs.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      return 1;
    }
    poVar5 = (ostream *)&kvs;
    anon_unknown.dwarf_266b9::show_stat
              (poVar5,(unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)0x0,
               need_singles);
    cVar2 = *argv[2];
    if (cVar2 == '1') {
      pcVar11 = "using pack()";
    }
    else {
      if (cVar2 != '2') {
        anon_unknown.dwarf_266b9::show_usage(poVar5);
        goto LAB_0011925f;
      }
      pcVar11 = "using rebuild()";
    }
    poVar5 = std::operator<<((ostream *)&std::cout,pcVar11);
    std::endl<char,std::char_traits<char>>(poVar5);
    reader._0_8_ = std::chrono::_V2::system_clock::now();
    (**(code **)((pKVar12->key)._M_dataplus._M_p + (ulong)(cVar2 != '1') * 8 + 0x38))(pKVar12);
    std::operator<<((ostream *)&std::cout,"- rearrangement time: ");
    dVar16 = anon_unknown.dwarf_266b9::StopWatch::operator()((StopWatch *)&reader,sec);
    poVar5 = std::ostream::_M_insert<double>(dVar16);
    poVar5 = std::operator<<(poVar5," sec");
    std::endl<char,std::char_traits<char>>(poVar5);
    anon_unknown.dwarf_266b9::show_stat
              ((ostream *)&kvs,
               (unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)0x0,
               need_singles_00);
    std::__cxx11::string::string((string *)&line,argv[4],(allocator *)&reader);
    std::__cxx11::string::append((char *)&line);
    std::__cxx11::string::string((string *)&dic_name,argv[3],(allocator *)&local_1570);
    anon_unknown.dwarf_266b9::get_ext((string *)&reader,&dic_name);
    std::__cxx11::string::append((string *)&line);
    std::__cxx11::string::~string((string *)&reader);
    std::__cxx11::string::~string((string *)&dic_name);
    std::ofstream::ofstream(&reader,(string *)&line,_S_out);
    uVar9 = *(uint *)(&reader.field_0x20 + *(long *)(reader._0_8_ + -0x18));
    if ((uVar9 & 5) == 0) {
      (**(code **)((pKVar12->key)._M_dataplus._M_p + 0x60))(pKVar12,&reader);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"failed to open ");
      poVar5 = std::operator<<(poVar5,(string *)&line);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::ofstream::~ofstream(&reader);
    if ((uVar9 & 5) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"write dic to ");
      poVar5 = std::operator<<(poVar5,(string *)&line);
      uVar9 = 0;
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      uVar9 = 1;
    }
    break;
  case '5':
    poVar5 = std::operator<<((ostream *)&std::cout,"generate random keys");
    std::endl<char,std::char_traits<char>>(poVar5);
    if ((uint)argc < 4) goto switchD_00118540_default;
    std::__cxx11::string::string((string *)&line,argv[2],(allocator *)&reader);
    anon_unknown.dwarf_266b9::read_dic((anon_unknown_dwarf_266b9 *)&local_1570,&line);
    std::__cxx11::string::~string((string *)&line);
    if (local_1570 == (pointer)0x0) {
      return 1;
    }
    kvs.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    kvs.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    kvs.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1560 = local_1570;
    (**(code **)((local_1570->key)._M_dataplus._M_p + 0x30))();
    __last = kvs.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pKVar12 = kvs.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
              super__Vector_impl_data._M_start;
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine
              ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)&reader);
    std::
    shuffle<__gnu_cxx::__normal_iterator<ddd::KvPair*,std::vector<ddd::KvPair,std::allocator<ddd::KvPair>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              ((__normal_iterator<ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
                )pKVar12,
               (__normal_iterator<ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
                )__last,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)&reader);
    if (argc == 4) {
      std::__cxx11::string::string((string *)&file_name,argv[3],(allocator *)&reader);
      std::__cxx11::string::append((char *)&file_name);
      std::ofstream::ofstream(&reader,(string *)&file_name,_S_out);
      uVar9 = *(uint *)(&reader.field_0x20 + *(long *)(reader._0_8_ + -0x18));
      if ((uVar9 & 5) == 0) {
        lVar13 = 0;
        for (uVar14 = 0;
            uVar14 < (ulong)(((long)kvs.
                                    super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)kvs.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x28);
            uVar14 = uVar14 + 1) {
          poVar5 = std::operator<<((ostream *)&reader,
                                   *(char **)((long)&((kvs.
                                                  super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->key).
                                                  _M_dataplus._M_p + lVar13));
          std::endl<char,std::char_traits<char>>(poVar5);
          lVar13 = lVar13 + 0x28;
        }
        poVar5 = std::operator<<((ostream *)&std::cout,"write ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        pcVar11 = " keys to ";
      }
      else {
        pcVar11 = "failed to open ";
        poVar5 = (ostream *)&std::cerr;
      }
      poVar5 = std::operator<<(poVar5,pcVar11);
      poVar5 = std::operator<<(poVar5,(string *)&file_name);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::ofstream::~ofstream(&reader);
      std::__cxx11::string::~string((string *)&file_name);
      if ((uVar9 & 5) != 0) goto LAB_00119081;
LAB_00119086:
      uVar9 = 0;
    }
    else {
      std::__cxx11::string::string((string *)&reader,argv[4],(allocator *)&file_name);
      iVar3 = std::__cxx11::stoi((string *)&reader,(size_t *)0x0,10);
      local_1550 = argv;
      std::__cxx11::string::~string((string *)&reader);
      poVar5 = std::operator<<((ostream *)&std::cout,"- ");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar3);
      poVar5 = std::operator<<(poVar5," patterns");
      std::endl<char,std::char_traits<char>>(poVar5);
      local_1558 = (ulong)iVar3;
      iVar4 = iVar3;
      if (iVar3 < 1) {
        iVar4 = 0;
      }
      local_1548 = (ulong)(iVar4 + 1);
      uVar14 = 1;
      local_1568 = iVar3;
      do {
        if (uVar14 == local_1548) goto LAB_00119086;
        std::__cxx11::stringstream::stringstream((stringstream *)&file_name);
        poVar5 = std::operator<<((ostream *)file_name.field_2._M_local_buf,local_1550[3]);
        poVar5 = std::operator<<(poVar5,".");
        *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 3;
        poVar5 = std::operator<<(poVar5,0x30);
        poVar5 = (ostream *)
                 std::ostream::operator<<((ostream *)poVar5,(int)(100 / (long)iVar3) * (int)uVar14);
        std::operator<<(poVar5,".keys");
        std::__cxx11::stringbuf::str();
        std::ofstream::ofstream(&reader,(string *)&dic_name,_S_out);
        std::__cxx11::string::~string((string *)&dic_name);
        local_1564 = *(uint *)(&reader.field_0x20 + *(long *)(reader._0_8_ + -0x18));
        if ((local_1564 & 5) == 0) {
          uVar6 = (ulong)(((long)kvs.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)kvs.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>.
                                _M_impl.super__Vector_impl_data._M_start) / 0x28) / local_1558;
          lVar13 = 0;
          for (uVar10 = 0; uVar10 < uVar6 * uVar14; uVar10 = uVar10 + 1) {
            poVar5 = std::operator<<((ostream *)&reader,
                                     *(char **)((long)&((kvs.
                                                  super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->key).
                                                  _M_dataplus._M_p + lVar13));
            std::endl<char,std::char_traits<char>>(poVar5);
            lVar13 = lVar13 + 0x28;
          }
          poVar5 = std::operator<<((ostream *)&std::cout,"write ");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          poVar5 = std::operator<<(poVar5," keys to ");
          std::__cxx11::stringbuf::str();
          iVar3 = local_1568;
          poVar5 = std::operator<<(poVar5,(string *)&dic_name);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cerr,"failed to open ");
          std::__cxx11::stringbuf::str();
          poVar5 = std::operator<<(poVar5,(string *)&dic_name);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        std::__cxx11::string::~string((string *)&dic_name);
        std::ofstream::~ofstream(&reader);
        std::__cxx11::stringstream::~stringstream((stringstream *)&file_name);
        uVar14 = uVar14 + 1;
      } while ((local_1564 & 5) == 0);
LAB_00119081:
      uVar9 = 1;
    }
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::~vector(&kvs);
    pcVar8 = (local_1560->key)._M_dataplus._M_p;
    pKVar12 = local_1560;
    goto LAB_00119423;
  default:
    goto switchD_00118540_default;
  }
  this_00 = &line;
LAB_00119418:
  std::__cxx11::string::~string((string *)this_00);
LAB_0011941d:
  pcVar8 = (pKVar12->key)._M_dataplus._M_p;
LAB_00119423:
  (**(code **)(pcVar8 + 8))(pKVar12);
  return uVar9;
}

Assistant:

int main(int argc, const char* argv[]) {
  if (argc < 2) {
    show_usage(std::cerr);
    return 1;
  }

  switch (*argv[1]) {
    case '1':
      return run_insertion(argc, argv);
    case '2':
      return run_deletion(argc, argv);
    case '3':
      return run_search(argc, argv);
    case '4':
      return run_rearrangement(argc, argv);
    case '5':
      return generate_keys(argc, argv);
    default:
      show_usage(std::cerr);
      break;
  }

  return 1;
}